

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::IfStmt::IfStmt(IfStmt *this,Var *var)

{
  enable_shared_from_this<kratos::Var> local_28;
  Var *local_18;
  Var *var_local;
  IfStmt *this_local;
  
  local_18 = var;
  var_local = (Var *)this;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_28);
  IfStmt(this,(shared_ptr<kratos::Var> *)&local_28);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_28);
  return;
}

Assistant:

explicit IfStmt(Var &var) : IfStmt(var.shared_from_this()) {}